

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

NumberParserImpl * __thiscall
icu_63::DecimalFormat::getParser(DecimalFormat *this,UErrorCode *status)

{
  atomic<icu_63::numparse::impl::NumberParserImpl_*> *paVar1;
  NumberParserImpl *pNVar2;
  NumberParserImpl *pNVar3;
  bool bVar4;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pNVar2 = (this->fields->atomicParser)._M_b._M_p;
    if (pNVar2 == (NumberParserImpl *)0x0) {
      pNVar2 = numparse::impl::NumberParserImpl::createParserFromProperties
                         ((this->fields->properties).
                          super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
                          (this->fields->symbols).
                          super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr,false,
                          status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (pNVar2 != (NumberParserImpl *)0x0) {
          paVar1 = &this->fields->atomicParser;
          LOCK();
          pNVar3 = (paVar1->_M_b)._M_p;
          bVar4 = pNVar3 == (NumberParserImpl *)0x0;
          if (bVar4) {
            (paVar1->_M_b)._M_p = pNVar2;
            pNVar3 = (NumberParserImpl *)0x0;
          }
          UNLOCK();
          if (bVar4) {
            return pNVar2;
          }
          (*(pNVar2->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])();
          return pNVar3;
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      pNVar2 = (NumberParserImpl *)0x0;
    }
  }
  else {
    pNVar2 = (NumberParserImpl *)0x0;
  }
  return pNVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }